

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-not-writable-after-shutdown.c
# Opt level: O3

void connect_cb(uv_connect_t *req,int status)

{
  uv_stream_t *puVar1;
  int iVar2;
  void *pvVar3;
  undefined8 *extraout_RDX;
  long lVar4;
  long *plVar5;
  undefined8 *__size;
  long *plVar6;
  uv_shutdown_t *puVar7;
  long lVar8;
  undefined1 auVar9 [16];
  int64_t eval_b;
  int64_t eval_b_1;
  uv_buf_t send_bufs [4096];
  undefined8 uStack_10060;
  code *pcStack_10058;
  code *pcStack_10050;
  long alStack_10048 [8195];
  
  puVar1 = connect_req.handle;
  plVar6 = alStack_10048;
  if (req == &connect_req) {
    alStack_10048[2] = (long)status;
    alStack_10048[0] = 0;
    if (alStack_10048[2] != 0) goto LAB_001d1f07;
    connect_cb_called = connect_cb_called + 1;
    lVar8 = 0;
    do {
      alStack_10048[0] = 0;
      lVar4 = 0;
      do {
        pcStack_10050 = (code *)0x1d1e10;
        auVar9 = uv_buf_init(send_buffer + bytes_sent,0x2728);
        *(long *)((long)alStack_10048 + lVar4 + 0x10U) = auVar9._0_8_;
        *(long *)((long)alStack_10048 + lVar4 + 0x18U) = auVar9._8_8_;
        bytes_sent = bytes_sent + 0x2728;
        lVar4 = lVar4 + 0x10;
      } while (lVar4 != 0x10000);
      pcStack_10050 = (code *)0x1d1e5c;
      iVar2 = uv_write(write_reqs + lVar8,puVar1,alStack_10048 + 2,0x1000,write_cb);
      alStack_10048[0] = (long)iVar2;
      alStack_10048[1] = 0;
      if (alStack_10048[0] != 0) {
        pcStack_10050 = (code *)0x1d1f02;
        connect_cb_cold_3();
        goto LAB_001d1f02;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    pcStack_10050 = (code *)0x1d1e99;
    iVar2 = uv_shutdown(&shutdown_req,puVar1,shutdown_cb);
    alStack_10048[0] = (long)iVar2;
    alStack_10048[1] = 0;
    if (alStack_10048[0] != 0) goto LAB_001d1f14;
    pcStack_10050 = (code *)0x1d1ec9;
    iVar2 = uv_read_start(puVar1,alloc_cb,read_cb);
    alStack_10048[0] = (long)iVar2;
    alStack_10048[1] = 0;
    if (alStack_10048[0] == 0) {
      return;
    }
  }
  else {
LAB_001d1f02:
    pcStack_10050 = (code *)0x1d1f07;
    connect_cb_cold_1();
LAB_001d1f07:
    pcStack_10050 = (code *)0x1d1f14;
    connect_cb_cold_2();
LAB_001d1f14:
    pcStack_10050 = (code *)0x1d1f21;
    connect_cb_cold_4();
  }
  plVar5 = alStack_10048 + 1;
  pcStack_10050 = write_cb;
  connect_cb_cold_5();
  if (plVar6 == (long *)0x0) {
    pcStack_10058 = (code *)0x1d1f50;
    write_cb_cold_2();
  }
  else if ((int)plVar5 == 0) {
    bytes_sent_done = bytes_sent_done + 0x2728000;
    write_cb_called = write_cb_called + 1;
    return;
  }
  iVar2 = (int)plVar5;
  puVar7 = (uv_shutdown_t *)((ulong)plVar5 & 0xffffffff);
  pcStack_10058 = shutdown_cb;
  write_cb_cold_1();
  if (puVar7 == &shutdown_req) {
    pcStack_10058 = (code *)(long)iVar2;
    uStack_10060 = 0;
    if (pcStack_10058 != (code *)0x0) goto LAB_001d1fda;
    pcStack_10058 = (code *)(shutdown_req.handle)->write_queue_size;
    uStack_10060 = 0;
    if (pcStack_10058 == (code *)0x0) {
      shutdown_cb_called = shutdown_cb_called + 1;
      pcStack_10058 = (code *)(long)write_cb_called;
      uStack_10060 = 3;
      if (pcStack_10058 == (code *)0x3) {
        return;
      }
      goto LAB_001d1ff8;
    }
  }
  else {
    shutdown_cb_cold_1();
LAB_001d1fda:
    shutdown_cb_cold_2();
  }
  shutdown_cb_cold_3();
LAB_001d1ff8:
  __size = &uStack_10060;
  shutdown_cb_cold_4();
  pvVar3 = malloc((size_t)__size);
  *extraout_RDX = pvVar3;
  extraout_RDX[1] = __size;
  return;
}

Assistant:

static void connect_cb(uv_connect_t* req, int status) {
  int r;
  ASSERT_OK(status);

  r = uv_shutdown(&shutdown_req, req->handle, shutdown_cb);
  ASSERT_OK(r);

  ASSERT_OK(uv_is_writable(req->handle));
}